

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O0

Hsh_IntObj_t * Hsh_IntObj(Hsh_IntMan_t *p,int iObj)

{
  Hsh_IntObj_t *local_20;
  int iObj_local;
  Hsh_IntMan_t *p_local;
  
  if (iObj == -1) {
    local_20 = (Hsh_IntObj_t *)0x0;
  }
  else {
    local_20 = (Hsh_IntObj_t *)Vec_WrdEntryP(p->vObjs,iObj);
  }
  return local_20;
}

Assistant:

static inline Hsh_IntObj_t *  Hsh_IntObj( Hsh_IntMan_t * p, int iObj )    { return iObj == -1 ? NULL : (Hsh_IntObj_t *)Vec_WrdEntryP( p->vObjs, iObj ); }